

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O2

PAL_ERROR __thiscall CorUnix::CPalThread::RunPreCreateInitializers(CPalThread *this)

{
  int iVar1;
  PAL_ERROR PVar2;
  
  InternalInitializeCriticalSection(&this->m_csLock);
  this->m_fLockInitialized = true;
  PVar2 = 0;
  iVar1 = pthread_mutex_init((pthread_mutex_t *)&this->m_startMutex,(pthread_mutexattr_t *)0x0);
  if (iVar1 == 0) {
    PVar2 = 0;
    iVar1 = pthread_cond_init((pthread_cond_t *)&this->m_startCond,(pthread_condattr_t *)0x0);
    if (iVar1 == 0) {
      this->m_fStartItemsInitialized = true;
      PVar2 = CThreadSynchronizationInfo::InitializePreCreate(&this->synchronizationInfo);
      if (PVar2 == 0) {
        PVar2 = CThreadSuspensionInfo::InitializePreCreate(&this->suspensionInfo);
        return PVar2;
      }
    }
    else {
      pthread_mutex_destroy((pthread_mutex_t *)&this->m_startMutex);
    }
  }
  return PVar2;
}

Assistant:

PAL_ERROR
CPalThread::RunPreCreateInitializers(
    void
    )
{
    PAL_ERROR palError = NO_ERROR;
    int iError;

    //
    // First, perform initialization of CPalThread private members
    //

    InternalInitializeCriticalSection(&m_csLock);
    m_fLockInitialized = TRUE;

    iError = pthread_mutex_init(&m_startMutex, NULL);
    if (0 != iError)
    {
        goto RunPreCreateInitializersExit;
    }

    iError = pthread_cond_init(&m_startCond, NULL);
    if (0 != iError)
    {
        pthread_mutex_destroy(&m_startMutex);
        goto RunPreCreateInitializersExit;
    }

    m_fStartItemsInitialized = TRUE;

    //
    // Call the pre-create initializers for embedded classes
    //

    palError = synchronizationInfo.InitializePreCreate();
    if (NO_ERROR != palError)
    {
        goto RunPreCreateInitializersExit;
    }

    palError = suspensionInfo.InitializePreCreate();
    if (NO_ERROR != palError)
    {
        goto RunPreCreateInitializersExit;
    }

    palError = apcInfo.InitializePreCreate();
    if (NO_ERROR != palError)
    {
        goto RunPreCreateInitializersExit;
    }

    palError = crtInfo.InitializePreCreate();
    if (NO_ERROR != palError)
    {
        goto RunPreCreateInitializersExit;
    }

RunPreCreateInitializersExit:

    return palError;
}